

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# happly.h
# Opt level: O1

void __thiscall
happly::TypedListProperty<unsigned_char>::writeDataASCII
          (TypedListProperty<unsigned_char> *this,ostream *outStream,size_t iElement)

{
  pointer puVar1;
  ulong uVar2;
  runtime_error *this_00;
  size_t iFlat;
  ulong uVar3;
  
  puVar1 = (this->flattenedIndexStart).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = puVar1[iElement];
  uVar2 = puVar1[iElement + 1];
  if (0xff < uVar2 - uVar3) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,
               "List property has an element with more entries than fit in a uchar. See note in README."
              );
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::ostream::_M_insert<unsigned_long>((ulong)outStream);
  *(undefined8 *)(outStream + *(long *)(*(long *)outStream + -0x18) + 8) = 0;
  if (uVar3 < uVar2) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(outStream," ",1);
      std::ostream::operator<<
                (outStream,
                 (uint)(this->flattenedData).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar3]);
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  return;
}

Assistant:

virtual void writeDataASCII(std::ostream& outStream, size_t iElement) override {
    size_t dataStart = flattenedIndexStart[iElement];
    size_t dataEnd = flattenedIndexStart[iElement + 1];

    // Get the number of list elements as a uchar, and ensure the value fits
    size_t dataCount = dataEnd - dataStart;
    if (dataCount > std::numeric_limits<uint8_t>::max()) {
      throw std::runtime_error(
          "List property has an element with more entries than fit in a uchar. See note in README.");
    }

    outStream << dataCount;
    outStream.precision(std::numeric_limits<T>::max_digits10);
    for (size_t iFlat = dataStart; iFlat < dataEnd; iFlat++) {
      outStream << " " << static_cast<typename SerializeType<T>::type>(flattenedData[iFlat]); // cast is usually a no-op
    }
  }